

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathUtils.h
# Opt level: O0

optional<int> slang::checkedSubS32(int32_t a,int32_t b)

{
  int in_ESI;
  int in_EDI;
  int32_t result;
  undefined4 in_stack_ffffffffffffffe8;
  _Optional_payload_base<int> local_8;
  
  if (SBORROW4(in_EDI,in_ESI)) {
    std::optional<int>::optional((optional<int> *)&local_8);
  }
  else {
    local_8 = (_Optional_payload_base<int>)
              std::make_optional<int&>((int *)CONCAT44(in_EDI - in_ESI,in_stack_ffffffffffffffe8));
  }
  return (optional<int>)local_8;
}

Assistant:

inline std::optional<int32_t> checkedSubS32(int32_t a, int32_t b) {
#if defined(_MSC_VER)
    int64_t p = int64_t(a) - int64_t(b);
    bool fits = p >= std::numeric_limits<int32_t>::min() &&
                p <= std::numeric_limits<int32_t>::max();
    return fits ? std::make_optional(int32_t(p)) : std::nullopt;
#else
    int32_t result;
    return __builtin_sub_overflow(a, b, &result) ? std::nullopt : std::make_optional(result);
#endif
}